

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  uint uVar2;
  Wal *pWal;
  u32 *puVar3;
  PgHdr *pPVar4;
  _func_int_sqlite3_file_ptr *p_Var5;
  bool bVar6;
  Pager *pPVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint *p;
  u32 uVar13;
  PgHdr **ppPVar14;
  long lVar15;
  sqlite3_int64 iOffset;
  Pgno nTruncate_00;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  PgHdr *pPVar19;
  long lVar20;
  u32 uVar21;
  int iVar22;
  bool bVar23;
  WalWriter w;
  u8 aFrame [24];
  int local_d8;
  ulong local_c0;
  WalWriter local_b8;
  ulong local_90;
  long local_88;
  PgHdr *local_80;
  PgHdr *local_78;
  long local_70;
  sqlite3_file *local_68;
  uint *local_60;
  long local_58;
  Pager *local_50;
  u32 local_48 [6];
  
  local_78 = pList;
  if (isCommit == 0) {
    iVar9 = 1;
  }
  else {
    iVar9 = 0;
    if (pList != (PgHdr *)0x0) {
      ppPVar14 = &local_78;
      do {
        if (pList->pgno <= nTruncate) {
          ppPVar14 = &pList->pDirty;
        }
        iVar9 = iVar9 + (uint)(pList->pgno <= nTruncate);
        pList = pList->pDirty;
        *ppPVar14 = pList;
      } while (pList != (PgHdr *)0x0);
    }
  }
  pPVar19 = local_78;
  pPager->aStat[2] = pPager->aStat[2] + iVar9;
  if (local_78->pgno == 1) {
    pager_write_changecounter(local_78);
  }
  pWal = pPager->pWal;
  local_90 = (ulong)(uint)pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  puVar3 = *pWal->apWiData;
  local_50 = pPager;
  iVar10 = bcmp(&pWal->hdr,puVar3,0x30);
  iVar9 = 0;
  uVar11 = 0;
  if (iVar10 != 0) {
    uVar11 = puVar3[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar3[0x18] != 0) {
      sqlite3_randomness(4,&local_b8);
      iVar9 = 0;
      if (pWal->exclusiveMode == '\0') {
        iVar9 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      }
      if (iVar9 != 5) {
        if (iVar9 != 0) goto LAB_0013c95c;
        walRestartHdr(pWal,(u32)local_b8.pWal);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
      }
    }
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
    }
    pWal->readLock = -1;
    iVar10 = 1;
    do {
      iVar9 = walTryBeginRead(pWal,(int *)&local_b8,1,iVar10);
      iVar10 = iVar10 + 1;
    } while (iVar9 == -1);
  }
LAB_0013c95c:
  if (iVar9 != 0) goto LAB_0013c960;
  uVar2 = (pWal->hdr).mxFrame;
  local_c0 = (ulong)uVar2;
  if (local_c0 == 0) {
    local_b8.pWal = (Wal *)0x18e22d0082067f37;
    uVar16 = pWal->nCkpt;
    local_b8.pFd = (sqlite3_file *)
                   CONCAT44(uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                            uVar16 << 0x18,
                            CONCAT13((char)local_90,
                                     CONCAT12((char)(local_90 >> 8),
                                              CONCAT11((char)(local_90 >> 0x10),
                                                       (char)(local_90 >> 0x18)))));
    if (uVar16 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_b8.iSyncPoint = *(long *)(pWal->hdr).aSalt;
    uVar21 = 0;
    uVar17 = 0xfffffffffffffff8;
    uVar13 = 0;
    do {
      uVar13 = uVar13 + uVar21 + *(int *)((long)&local_b8.pFd + uVar17);
      uVar21 = uVar21 + *(int *)((long)&local_b8.pFd + uVar17 + 4) + uVar13;
      uVar17 = uVar17 + 8;
    } while (uVar17 < 0x10);
    local_b8.syncFlags =
         CONCAT13((char)uVar13,
                  CONCAT12((char)(uVar13 >> 8),
                           CONCAT11((char)(uVar13 >> 0x10),(char)(uVar13 >> 0x18))));
    local_b8.szPage =
         CONCAT13((char)uVar21,
                  CONCAT12((char)(uVar21 >> 8),
                           CONCAT11((char)(uVar21 >> 0x10),(char)(uVar21 >> 0x18))));
    pWal->szPage = (u32)local_90;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar13;
    (pWal->hdr).aFrameCksum[1] = uVar21;
    pWal->truncateOnCommit = '\x01';
    bVar23 = false;
    iVar10 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_b8,0x20,0);
    if (iVar10 == 0) {
      if (pWal->syncHeader != '\0') {
        if ((bVar1 >> 2 & 3) == 0) {
          iVar10 = 0;
        }
        else {
          iVar10 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,bVar1 >> 2 & 3);
        }
        if (iVar10 != 0) {
          bVar23 = false;
          goto LAB_0013cae5;
        }
      }
      iVar10 = 0;
      bVar23 = true;
    }
LAB_0013cae5:
    iVar9 = iVar10;
    local_d8 = iVar10;
    if (!bVar23) goto LAB_0013c960;
  }
  else {
    iVar10 = 0;
  }
  local_b8.pFd = pWal->pWalFd;
  local_b8.iSyncPoint = 0;
  local_b8.szPage = (int)local_90;
  local_88 = (long)(local_b8.szPage + 0x18);
  lVar15 = local_c0 * local_88 + 0x20;
  local_80 = (PgHdr *)0x0;
  local_b8.pWal = pWal;
  local_b8.syncFlags = (uint)bVar1;
  local_68 = local_b8.pFd;
  iVar18 = local_d8;
  for (pPVar4 = pPVar19; pPVar4 != (PgHdr *)0x0; pPVar4 = pPVar4->pDirty) {
    local_d8 = iVar18;
    if ((uVar11 == 0) || ((isCommit != 0 && (pPVar4->pDirty == (PgHdr *)0x0)))) {
LAB_0013cbfa:
      if (isCommit == 0) {
        nTruncate_00 = 0;
      }
      else {
        nTruncate_00 = 0;
        if (pPVar4->pDirty == (PgHdr *)0x0) {
          nTruncate_00 = nTruncate;
        }
      }
      local_c0 = (ulong)((int)local_c0 + 1);
      iVar10 = walWriteOneFrame(&local_b8,pPVar4,nTruncate_00,lVar15);
      bVar23 = iVar10 == 0;
      iVar9 = iVar10;
      if (bVar23) {
        *(byte *)&pPVar4->flags = (byte)pPVar4->flags | 0x40;
        lVar15 = lVar15 + local_88;
        iVar10 = 0;
        iVar9 = local_d8;
        local_80 = pPVar4;
      }
      local_d8 = iVar9;
      bVar23 = !bVar23;
    }
    else {
      local_48[0] = 0;
      sqlite3WalFindFrame(pWal,pPVar4->pgno,local_48);
      uVar21 = local_48[0];
      bVar23 = false;
      if (uVar11 <= local_48[0]) {
        if (local_48[0] <= pWal->iReCksum - 1) {
          pWal->iReCksum = local_48[0];
        }
        iVar10 = (*pWal->pWalFd->pMethods->xWrite)
                           (pWal->pWalFd,pPVar4->pData,(int)local_90,
                            (ulong)(local_48[0] - 1) * local_88 + 0x38);
        bVar23 = true;
        local_d8 = iVar10;
        if (iVar10 == 0) {
          *(byte *)&pPVar4->flags = (byte)pPVar4->flags & 0xbf;
          bVar23 = false;
          local_d8 = iVar18;
        }
      }
      if (uVar21 < uVar11) goto LAB_0013cbfa;
    }
    iVar9 = local_d8;
    if (bVar23) goto LAB_0013c960;
    uVar2 = (uint)local_c0;
    iVar18 = local_d8;
  }
  if ((isCommit != 0) && (pWal->iReCksum != 0)) {
    lVar20 = (long)(int)pWal->szPage + 0x18;
    iVar10 = (int)lVar20;
    local_70 = lVar15;
    p = (uint *)sqlite3_malloc(iVar10);
    if (p == (uint *)0x0) {
      iVar9 = 7;
    }
    else {
      lVar15 = 0x18;
      if (pWal->iReCksum != 1) {
        lVar15 = (ulong)(pWal->iReCksum - 2) * lVar20 + 0x30;
      }
      iVar9 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar15);
      uVar11 = *p;
      (pWal->hdr).aFrameCksum[0] =
           uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar11 = p[1];
      (pWal->hdr).aFrameCksum[1] =
           uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      uVar11 = pWal->iReCksum;
      pWal->iReCksum = 0;
      if (uVar11 <= uVar2 && iVar9 == 0) {
        local_58 = (long)iVar10;
        local_60 = p + 6;
        do {
          lVar15 = (ulong)(uVar11 - 1) * local_58 + 0x20;
          iVar9 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar10,lVar15);
          if (iVar9 == 0) {
            uVar16 = *p;
            uVar12 = p[1];
            walEncodeFrame(pWal,uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                                uVar16 << 0x18,
                           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                           uVar12 << 0x18,(u8 *)local_60,(u8 *)local_48);
            iVar9 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,local_48,0x18,lVar15);
          }
        } while ((uVar11 + 1 <= uVar2) && (uVar11 = uVar11 + 1, iVar9 == 0));
      }
      sqlite3_free(p);
    }
    if (iVar9 != 0) goto LAB_0013c960;
    iVar10 = 0;
    lVar15 = local_70;
  }
  iVar22 = 0;
  if ((isCommit != 0) && ((bVar1 & 3) != 0)) {
    if (pWal->padToSectorBoundary == '\0') {
      bVar23 = true;
      iVar22 = 0;
LAB_0013cee3:
      bVar6 = true;
      if (bVar23) {
        iVar10 = (*local_68->pMethods->xSync)(local_68,bVar1 & 3);
      }
    }
    else {
      p_Var5 = pWal->pWalFd->pMethods->xSectorSize;
      if (p_Var5 == (_func_int_sqlite3_file_ptr *)0x0) {
        uVar11 = 0x1000;
      }
      else {
        uVar11 = (*p_Var5)(pWal->pWalFd);
      }
      uVar16 = 0x10000;
      if ((int)uVar11 < 0x10000) {
        uVar16 = uVar11;
      }
      uVar12 = 0x200;
      if (0x1f < (int)uVar11) {
        uVar12 = uVar16;
      }
      lVar20 = lVar15 + (ulong)uVar12 + -1;
      lVar20 = lVar20 - lVar20 % (long)(ulong)uVar12;
      iVar22 = 0;
      bVar23 = lVar20 == lVar15;
      bVar6 = !bVar23 && lVar15 <= lVar20;
      iVar9 = iVar18;
      local_b8.iSyncPoint = lVar20;
      if ((lVar15 < lVar20) &&
         (local_70 = lVar15, iVar10 = walWriteOneFrame(&local_b8,local_80,nTruncate,lVar15),
         iVar9 = iVar10, iVar10 == 0)) {
        iOffset = local_70 + local_88;
        iVar8 = 1;
        do {
          iVar22 = iVar8;
          bVar6 = iOffset < lVar20;
          if (lVar20 <= iOffset) {
            iVar10 = 0;
            iVar9 = iVar18;
            break;
          }
          iVar10 = walWriteOneFrame(&local_b8,local_80,nTruncate,iOffset);
          iOffset = iOffset + local_88;
          iVar9 = iVar10;
          iVar8 = iVar22 + 1;
        } while (iVar10 == 0);
      }
      iVar18 = iVar9;
      if (!bVar6) goto LAB_0013cee3;
      bVar6 = false;
    }
    iVar9 = iVar18;
    if (!bVar6) goto LAB_0013c960;
  }
  if (((isCommit != 0) && (pWal->truncateOnCommit != '\0')) &&
     (lVar15 = pWal->mxWalSize, -1 < lVar15)) {
    lVar20 = (ulong)(uVar2 + iVar22) * local_88 + 0x20;
    if (lVar20 <= lVar15) {
      lVar20 = lVar15;
    }
    walLimitSize(pWal,lVar20);
    pWal->truncateOnCommit = '\0';
  }
  uVar21 = (pWal->hdr).mxFrame;
  while ((pPVar4 = local_80, pPVar19 != (PgHdr *)0x0 && (iVar10 == 0))) {
    iVar10 = 0;
    if ((pPVar19->flags & 0x40) != 0) {
      uVar21 = uVar21 + 1;
      iVar10 = walIndexAppend(pWal,uVar21,pPVar19->pgno);
    }
    pPVar19 = pPVar19->pDirty;
  }
  bVar23 = iVar10 == 0;
  if ((bVar23) && (0 < iVar22)) {
    do {
      uVar21 = uVar21 + 1;
      iVar10 = walIndexAppend(pWal,uVar21,pPVar4->pgno);
      bVar23 = iVar10 == 0;
      if (!bVar23) break;
      bVar6 = 1 < iVar22;
      iVar22 = iVar22 + -1;
    } while (bVar6);
  }
  iVar9 = iVar10;
  if (bVar23) {
    (pWal->hdr).szPage = (ushort)(local_90 >> 0x10) | (ushort)local_90 & 0xff00;
    (pWal->hdr).mxFrame = uVar21;
    if (isCommit != 0) {
      puVar3 = &(pWal->hdr).iChange;
      *puVar3 = *puVar3 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar21;
    }
  }
LAB_0013c960:
  pPVar7 = local_50;
  if ((iVar9 == 0) &&
     (pPVar19 = local_78, local_78 != (PgHdr *)0x0 && local_50->pBackup != (sqlite3_backup *)0x0)) {
    do {
      if (pPVar7->pBackup != (sqlite3_backup *)0x0) {
        backupUpdate(pPVar7->pBackup,pPVar19->pgno,(u8 *)pPVar19->pData);
      }
      pPVar19 = pPVar19->pDirty;
    } while (pPVar19 != (PgHdr *)0x0);
  }
  return iVar9;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}